

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseReservedNumbers
          (Parser *this,EnumDescriptorProto *message,LocationRecorder *parent_location)

{
  int iVar1;
  uint uVar2;
  Rep *pRVar3;
  Tokenizer *pTVar4;
  Parser *this_00;
  RepeatedPtrFieldBase *this_01;
  bool bVar5;
  undefined8 in_RAX;
  EnumDescriptorProto_EnumReservedRange *obj;
  void *pvVar6;
  char *error;
  int end;
  int start;
  LocationRecorder start_location;
  Token start_token;
  LocationRecorder location;
  int local_c4;
  Parser *local_c0;
  uint local_b8;
  int local_b4;
  LocationRecorder *local_b0;
  EnumDescriptorProto *local_a8;
  LocationRecorder local_a0;
  RepeatedPtrFieldBase *local_88;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined8 local_58;
  ColumnNumber local_50;
  LocationRecorder local_48;
  
  local_88 = &(message->reserved_range_).super_RepeatedPtrFieldBase;
  local_b8 = (uint)CONCAT71((int7)((ulong)in_RAX >> 8),1);
  local_c0 = this;
  local_b0 = parent_location;
  local_a8 = message;
  do {
    this_01 = local_88;
    LocationRecorder::LocationRecorder
              (&local_48,local_b0,
               (local_a8->reserved_range_).super_RepeatedPtrFieldBase.current_size_);
    pRVar3 = (local_a8->reserved_range_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar3 == (Rep *)0x0) {
LAB_0034603f:
      obj = Arena::CreateMaybeMessage<google::protobuf::EnumDescriptorProto_EnumReservedRange>
                      (this_01->arena_);
      pvVar6 = internal::RepeatedPtrFieldBase::AddOutOfLineHelper(this_01,obj);
    }
    else {
      iVar1 = (local_a8->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
      if (pRVar3->allocated_size <= iVar1) goto LAB_0034603f;
      (local_a8->reserved_range_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      pvVar6 = pRVar3->elements[iVar1];
    }
    local_70 = 0;
    local_68._M_local_buf[0] = '\0';
    local_78._M_p = (pointer)&local_68;
    LocationRecorder::LocationRecorder(&local_a0,&local_48,1);
    this_00 = local_c0;
    pTVar4 = local_c0->input_;
    local_80._0_4_ = (pTVar4->current_).type;
    std::__cxx11::string::_M_assign((string *)&local_78);
    local_50 = (pTVar4->current_).end_column;
    local_58._0_4_ = (pTVar4->current_).line;
    local_58._4_4_ = (pTVar4->current_).column;
    error = "Expected enum number range.";
    if ((local_b8 & 1) != 0) {
      error = "Expected enum value or number range.";
    }
    bVar5 = ConsumeSignedInteger(this_00,&local_b4,error);
    LocationRecorder::~LocationRecorder(&local_a0);
    if (bVar5) {
      bVar5 = TryConsume(local_c0,"to");
      if (bVar5) {
        LocationRecorder::LocationRecorder(&local_a0,&local_48,2);
        bVar5 = TryConsume(local_c0,"max");
        if (bVar5) {
          local_c4 = 0x7fffffff;
        }
        else {
          bVar5 = ConsumeSignedInteger(local_c0,&local_c4,"Expected integer.");
          if (!bVar5) {
            LocationRecorder::~LocationRecorder(&local_a0);
            bVar5 = false;
            goto LAB_003461d5;
          }
        }
      }
      else {
        LocationRecorder::LocationRecorder(&local_a0,&local_48,2);
        LocationRecorder::StartAt(&local_a0,(Token *)local_80);
        LocationRecorder::EndAt(&local_a0,(Token *)local_80);
        local_c4 = local_b4;
      }
      LocationRecorder::~LocationRecorder(&local_a0);
      uVar2 = *(uint *)((long)pvVar6 + 0x10);
      *(uint *)((long)pvVar6 + 0x10) = uVar2 | 1;
      *(int *)((long)pvVar6 + 0x18) = local_b4;
      *(uint *)((long)pvVar6 + 0x10) = uVar2 | 3;
      *(int *)((long)pvVar6 + 0x1c) = local_c4;
      bVar5 = true;
      local_b8 = 0;
    }
    else {
      bVar5 = false;
    }
LAB_003461d5:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_p != &local_68) {
      operator_delete(local_78._M_p);
    }
    LocationRecorder::~LocationRecorder(&local_48);
    if (!bVar5) {
      return false;
    }
    bVar5 = TryConsume(local_c0,",");
    if (!bVar5) {
      bVar5 = ConsumeEndOfDeclaration(local_c0,";",local_b0);
      return bVar5;
    }
  } while( true );
}

Assistant:

bool Parser::ParseReservedNumbers(EnumDescriptorProto* message,
                                  const LocationRecorder& parent_location) {
  bool first = true;
  do {
    LocationRecorder location(parent_location, message->reserved_range_size());

    EnumDescriptorProto::EnumReservedRange* range =
        message->add_reserved_range();
    int start, end;
    io::Tokenizer::Token start_token;
    {
      LocationRecorder start_location(
          location, EnumDescriptorProto::EnumReservedRange::kStartFieldNumber);
      start_token = input_->current();
      DO(ConsumeSignedInteger(&start,
                              (first ? "Expected enum value or number range."
                                     : "Expected enum number range.")));
    }

    if (TryConsume("to")) {
      LocationRecorder end_location(
          location, EnumDescriptorProto::EnumReservedRange::kEndFieldNumber);
      if (TryConsume("max")) {
        // This is in the enum descriptor path, which doesn't have the message
        // set duality to fix up, so it doesn't integrate with the sentinel.
        end = INT_MAX;
      } else {
        DO(ConsumeSignedInteger(&end, "Expected integer."));
      }
    } else {
      LocationRecorder end_location(
          location, EnumDescriptorProto::EnumReservedRange::kEndFieldNumber);
      end_location.StartAt(start_token);
      end_location.EndAt(start_token);
      end = start;
    }

    range->set_start(start);
    range->set_end(end);
    first = false;
  } while (TryConsume(","));

  DO(ConsumeEndOfDeclaration(";", &parent_location));
  return true;
}